

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool MomentChi2Test(HashInfo *info)

{
  double dVar1;
  pfHash p_Var2;
  long lVar3;
  uint uVar4;
  char *__s;
  uint i;
  uint uVar5;
  longdouble lVar6;
  longdouble lVar7;
  unsigned_long l;
  uint local_a4;
  unsigned_long h;
  int local_94;
  uint k;
  longdouble local_8c;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  double local_60;
  longdouble local_54;
  longdouble local_48;
  longdouble local_3c;
  
  p_Var2 = info->hash;
  if ((p_Var2 == sha1_32a || p_Var2 == md5_32) || (0x80 < info->hashbits)) {
    uVar4 = (g_testExtra ^ 1) * 3 + 3;
  }
  else {
    uVar4 = 3;
  }
  k = 0;
  (*p_Var2)(&k,4,0,&l);
  printf("Running 1st unseeded MomentChi2 for the low 32bits/step %d ... ",(ulong)uVar4);
  fflush((FILE *)0x0);
  local_48 = (longdouble)0;
  lVar6 = local_48;
  for (local_a4 = 1; local_a4 < 0xfffffff1; local_a4 = local_a4 + uVar4) {
    local_8c = local_48;
    (*p_Var2)(&local_a4,4,0,&h);
    lVar3 = POPCOUNT(l ^ h);
    local_80 = lVar3 * lVar3 * lVar3 * lVar3 * lVar3;
    local_78 = local_80 * local_80;
    local_48 = (longdouble)local_80 + local_8c;
    lVar6 = lVar6 + (longdouble)local_78;
    l = h;
  }
  local_94 = (int)(0xfffffff0 / (ulong)uVar4);
  local_3c = (longdouble)local_94;
  local_48 = local_48 / local_3c;
  local_54 = (lVar6 / local_3c - local_48 * local_48) / local_3c;
  printf("%Lf - %Lf\n");
  printf("Running 2nd   seeded MomentChi2 for the low 32bits/step %d ... ",(ulong)uVar4);
  fflush((FILE *)0x0);
  (*p_Var2)(&k,4,0,&l);
  lVar6 = (longdouble)0;
  lVar7 = lVar6;
  for (uVar5 = 1; uVar5 < 0xfffffff1; uVar5 = uVar5 + uVar4) {
    local_8c = lVar6;
    (*p_Var2)(&k,4,uVar5,&h);
    lVar3 = POPCOUNT(l ^ h);
    local_70 = lVar3 * lVar3 * lVar3 * lVar3 * lVar3;
    local_68 = local_70 * local_70;
    lVar7 = (longdouble)local_70 + lVar7;
    lVar6 = (longdouble)local_68 + local_8c;
    l = h;
  }
  lVar7 = lVar7 / local_3c;
  dVar1 = (double)(((local_48 - lVar7) * (local_48 - lVar7)) /
                  (local_54 + (lVar6 / local_3c - lVar7 * lVar7) / local_3c));
  local_60 = dVar1;
  printf("%Lf - %Lf\nKeySeedMomentChi2:\t%g\t");
  fflush((FILE *)0x0);
  __s = "FAIL!!!!";
  if (dVar1 <= 3.84145882069413) {
    __s = "PASS";
  }
  puts(__s);
  fflush((FILE *)0x0);
  return dVar1 <= 3.84145882069413;
}

Assistant:

bool MomentChi2Test ( struct HashInfo *info )
{
  pfHash hash = info->hash;
  const int size = info->hashbits / 8;
  const int step = ((hash == md5_32 || hash == sha1_32a || info->hashbits > 128)
                    && !g_testExtra) ? 6 : 3;
  unsigned k = 0, s = 0;
  unsigned long l, h, x;
  const unsigned mx = 0xfffffff0;
  long double sa=0, saa=0, sb=0, sbb=0,	n = mx/step;
  hash(&k,sizeof(k),s,&l);
  printf("Running 1st unseeded MomentChi2 for the low 32bits/step %d ... ", step);
  fflush(NULL);
  for(unsigned i=1; i<=mx; i+=step){
    hash(&i,sizeof(i),s,&h);
    x = popcount8(l^h); // check the lower 32bits only
    x = x*x*x*x*x;
    sa+=x; saa+=x*x; l=h;
  }
  sa/=n; saa=(saa/n-sa*sa)/n;
  printf("%Lf - %Lf\n", sa, saa);
  printf("Running 2nd   seeded MomentChi2 for the low 32bits/step %d ... ", step);
  fflush(NULL);
  hash(&k,sizeof(k),s,&l);
  for(unsigned i=1; i<=mx; i+=step){
    hash(&k,sizeof(k),i,&h);
    x = popcount8(l^h);
    x = x*x*x*x*x;
    sb+=x; sbb+=x*x; l=h;
  }
  sb/=n; sbb=(sbb/n-sb*sb)/n;

  double chi2=(sa-sb)*(sa-sb)/(saa+sbb);
  printf("%Lf - %Lf\nKeySeedMomentChi2:\t%g\t", sb, sbb, chi2);
  fflush(NULL);
  if (chi2 > 3.84145882069413)
  {
    printf("FAIL!!!!\n");
    fflush(NULL);
    return false;
  }
  else
  {
    printf("PASS\n");
    fflush(NULL);
    return true;
  }
}